

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queryOutputWindow.cpp
# Opt level: O2

void __thiscall QueryOutputWindow::print(QueryOutputWindow *this,string *message,Type type)

{
  QueryOutputMessage *this_00;
  QueryOutputMessage *local_58;
  string local_50;
  
  this_00 = (QueryOutputMessage *)operator_new(0x28);
  std::__cxx11::string::string((string *)&local_50,(string *)message);
  QueryOutputMessage::QueryOutputMessage(this_00,&local_50,type);
  local_58 = this_00;
  std::vector<QueryOutputMessage*,std::allocator<QueryOutputMessage*>>::
  emplace_back<QueryOutputMessage*>
            ((vector<QueryOutputMessage*,std::allocator<QueryOutputMessage*>> *)&this->buffer,
             &local_58);
  std::__cxx11::string::~string((string *)&local_50);
  mvwprintw((this->super_IWindow).window,this->lineCounter,0,(message->_M_dataplus)._M_p);
  (*(this->super_IWindow)._vptr_IWindow[4])(this);
  this->lineCounter = this->lineCounter + 1;
  return;
}

Assistant:

void QueryOutputWindow::print(std::string message, QueryOutputMessage::Type type)
{
	this->buffer.push_back(new QueryOutputMessage(message, type));

	mvwprintw(this->window, this->lineCounter, 0, message.c_str());
	this->update();
	this->lineCounter++;
}